

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O3

Params * adios2::helper::BuildParametersMap
                   (Params *__return_storage_ptr__,string *input,char delimKeyValue,char delimItem)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  istream *piVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 *puVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  size_type *psVar10;
  long *plVar11;
  string parameter;
  string value;
  string key;
  istringstream inputSS;
  string local_308;
  string local_2e8;
  string local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  int local_23c;
  string local_238;
  string local_218;
  long *local_1f8;
  ulong local_1f0;
  long local_1e8;
  long lStack_1e0;
  _Base_ptr local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1d8 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_1d8;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_1d8;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8 = &__return_storage_ptr__->_M_t;
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_260.field_2;
  local_23c = (int)delimItem;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_280,(char)local_23c);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      return (Params *)local_2a8;
    }
    lVar3 = std::__cxx11::string::find((char)&local_280,(ulong)(uint)(int)delimKeyValue);
    if (lVar3 == -1) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Helper","");
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"adiosString","");
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"BuildParametersMap","");
      std::operator+(&local_2a0,"wrong format for IO parameter ",&local_280);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      psVar10 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_308.field_2._M_allocated_capacity = *psVar10;
        local_308.field_2._8_8_ = plVar4[3];
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar10;
        local_308._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_308._M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_308,local_308._M_string_length,0,'\x01');
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      psVar10 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_2e8.field_2._M_allocated_capacity = *psVar10;
        local_2e8.field_2._8_8_ = plVar4[3];
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar10;
        local_2e8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_2e8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      psVar10 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_260.field_2._M_allocated_capacity = *psVar10;
        local_260.field_2._8_8_ = plVar4[3];
        local_260._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_260.field_2._M_allocated_capacity = *psVar10;
        local_260._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_260._M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      Throw<std::invalid_argument>(&local_218,&local_238,&local_2c8,&local_260,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_280);
    std::__cxx11::string::find_first_not_of((char *)&local_218,0x743c2e,0);
    std::__cxx11::string::erase((ulong)&local_218,0);
    lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_218,0x743c2e,0xffffffffffffffff);
    uVar5 = lVar3 + 1;
    if (local_218._M_string_length < uVar5) break;
    local_218._M_dataplus._M_p[uVar5] = '\0';
    local_218._M_string_length = uVar5;
    std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_280);
    std::__cxx11::string::find_first_not_of((char *)&local_238,0x743c2e,0);
    std::__cxx11::string::erase((ulong)&local_238,0);
    lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_238,0x743c2e,0xffffffffffffffff);
    uVar5 = lVar3 + 1;
    if (local_238._M_string_length < uVar5) goto LAB_0041058c;
    local_238._M_dataplus._M_p[uVar5] = '\0';
    local_238._M_string_length = uVar5;
    if (uVar5 == 0) {
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Helper","");
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"adiosString","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"BuildParametersMap","");
      std::operator+(&local_1d0,"empty value in IO parameter ",&local_280);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      local_1f8 = &local_1e8;
      plVar11 = plVar4 + 2;
      if ((long *)*plVar4 == plVar11) {
        local_1e8 = *plVar11;
        lStack_1e0 = plVar4[3];
      }
      else {
        local_1e8 = *plVar11;
        local_1f8 = (long *)*plVar4;
      }
      local_1f0 = plVar4[1];
      *plVar4 = (long)plVar11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f0,0,'\x01');
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      psVar10 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_2a0.field_2._M_allocated_capacity = *psVar10;
        local_2a0.field_2._8_8_ = plVar4[3];
      }
      else {
        local_2a0.field_2._M_allocated_capacity = *psVar10;
        local_2a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_2a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_308.field_2._M_allocated_capacity = *psVar10;
        local_308.field_2._8_8_ = puVar6[3];
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar10;
        local_308._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_308._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      Throw<std::invalid_argument>(&local_2c8,&local_260,&local_2e8,&local_308,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
    }
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_2a8,&local_218);
    if (cVar7._M_node != local_1d8) {
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Helper","");
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"adiosString","");
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"BuildParametersMap","");
      std::operator+(&local_2a0,"key ",&local_218);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_308.field_2._M_allocated_capacity = *psVar10;
        local_308.field_2._8_8_ = puVar6[3];
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar10;
        local_308._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_308._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      Throw<std::invalid_argument>(&local_2c8,&local_260,&local_2e8,&local_308,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2a8,&local_218);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar5);
LAB_0041058c:
  uVar9 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar5);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_2a8);
  _Unwind_Resume(uVar9);
}

Assistant:

Params BuildParametersMap(const std::string &input, const char delimKeyValue, const char delimItem)
{
    auto lf_Trim = [](std::string &input) {
        input.erase(0, input.find_first_not_of(" \n\r\t")); // prefixing spaces
        input.erase(input.find_last_not_of(" \n\r\t") + 1); // suffixing spaces
    };

    Params parametersOutput;

    std::istringstream inputSS(input);
    std::string parameter;
    while (std::getline(inputSS, parameter, delimItem))
    {
        const size_t position = parameter.find(delimKeyValue);
        if (position == parameter.npos)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "wrong format for IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value for each entry");
        }

        std::string key = parameter.substr(0, position);
        lf_Trim(key);
        std::string value = parameter.substr(position + 1);
        lf_Trim(value);
        if (value.length() == 0)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "empty value in IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value");
        }
        if (parametersOutput.count(key) == 1)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosString", "BuildParametersMap",
                "key " + key + " appears multiple times in the parameters string");
        }

        parametersOutput[key] = value;
    }

    return parametersOutput;
}